

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

AllocaTrackedIndex *
dxil_spv::gep_pointer_to_alloca_tracked_inst
          (AllocaTrackedIndex *__return_storage_ptr__,Impl *impl,Value *ptr)

{
  GetElementPtrInst *this;
  Value *pVVar1;
  iterator iVar2;
  AllocaInst *alloca_inst;
  
  this = LLVMBC::dyn_cast<LLVMBC::GetElementPtrInst>(ptr);
  if (this != (GetElementPtrInst *)0x0) {
    pVVar1 = LLVMBC::Instruction::getOperand(&this->super_Instruction,0);
    alloca_inst = LLVMBC::dyn_cast<LLVMBC::AllocaInst>(pVVar1);
    if ((alloca_inst != (AllocaInst *)0x0) &&
       (iVar2 = std::
                _Hashtable<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(impl->alloca_tracking)._M_h,&alloca_inst),
       iVar2.
       super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
       ._M_cur != (__node_type *)0x0)) {
      __return_storage_ptr__->alloca_inst = alloca_inst;
      pVVar1 = LLVMBC::Instruction::getOperand(&this->super_Instruction,2);
      __return_storage_ptr__->index = pVVar1;
      (__return_storage_ptr__->itr).
      super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
      ._M_cur = (__node_type *)
                iVar2.
                super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
                ._M_cur;
      __return_storage_ptr__->cbv_handle =
           *(Value **)
            ((long)iVar2.
                   super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
                   ._M_cur + 0x10);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->itr).
  super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
  ._M_cur = (__node_type *)0x0;
  __return_storage_ptr__->cbv_handle = (Value *)0x0;
  __return_storage_ptr__->alloca_inst = (AllocaInst *)0x0;
  __return_storage_ptr__->index = (Value *)0x0;
  return __return_storage_ptr__;
}

Assistant:

static AllocaTrackedIndex gep_pointer_to_alloca_tracked_inst(Converter::Impl &impl, const llvm::Value *ptr)
{
	if (const auto *gep_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(ptr))
	{
		if (const auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(gep_inst->getOperand(0)))
		{
			auto itr = impl.alloca_tracking.find(alloca_inst);
			if (itr != impl.alloca_tracking.end())
				return { alloca_inst, gep_inst->getOperand(2), itr, itr->second.cbv_handle };
		}
	}

	return {};
}